

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O3

void lowbd_fwd_txfm2d_32x16_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  byte bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  int8_t *piVar8;
  bool bVar9;
  int16_t *piVar10;
  uint uVar11;
  undefined7 in_register_00000009;
  long lVar12;
  longlong *plVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  __m256i *in;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  __m256i buf0 [32];
  __m256i buf1 [64];
  int32_t *local_c80;
  code *local_c78 [2];
  int16_t *local_c68;
  longlong local_c60 [128];
  longlong local_860 [262];
  
  piVar8 = av1_fwd_txfm_shift_ls[10];
  uVar15 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  local_c78[1] = *(code **)((long)col_txfm16x16_arr + uVar15);
  local_c78[0] = *(code **)((long)row_txfm16x32_arr + uVar15);
  lVar14 = 0;
  in = (__m256i *)local_c60;
  bVar9 = true;
  local_c80 = output;
  local_c68 = input;
  do {
    bVar16 = bVar9;
    piVar10 = local_c68 + lVar14 * 0x10;
    if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
      lVar12 = 0x200;
      do {
        uVar2 = *(undefined8 *)(piVar10 + 4);
        uVar3 = *(undefined8 *)(piVar10 + 8);
        uVar4 = *(undefined8 *)(piVar10 + 0xc);
        *(undefined8 *)((long)&local_c80 + lVar12) = *(undefined8 *)piVar10;
        *(undefined8 *)((long)local_c78 + lVar12) = uVar2;
        *(undefined8 *)((long)local_c78 + lVar12 + 8) = uVar3;
        *(undefined8 *)((long)&local_c68 + lVar12) = uVar4;
        piVar10 = piVar10 + stride;
        lVar12 = lVar12 + -0x20;
      } while (lVar12 != 0);
    }
    else {
      lVar12 = 0;
      do {
        uVar2 = *(undefined8 *)(piVar10 + 4);
        uVar3 = *(undefined8 *)(piVar10 + 8);
        uVar4 = *(undefined8 *)(piVar10 + 0xc);
        *(undefined8 *)((long)local_c60 + lVar12) = *(undefined8 *)piVar10;
        *(undefined8 *)((long)local_c60 + lVar12 + 8) = uVar2;
        *(undefined8 *)((long)local_c60 + lVar12 + 0x10) = uVar3;
        *(undefined8 *)((long)local_c60 + lVar12 + 0x18) = uVar4;
        lVar12 = lVar12 + 0x20;
        piVar10 = piVar10 + stride;
      } while (lVar12 != 0x200);
    }
    bVar1 = *piVar8;
    uVar11 = (uint)(char)bVar1;
    if ((int)uVar11 < 0) {
      auVar20._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
      auVar20._2_2_ = auVar20._0_2_;
      auVar20._4_2_ = auVar20._0_2_;
      auVar20._6_2_ = auVar20._0_2_;
      auVar20._8_2_ = auVar20._0_2_;
      auVar20._10_2_ = auVar20._0_2_;
      auVar20._12_2_ = auVar20._0_2_;
      auVar20._14_2_ = auVar20._0_2_;
      auVar20._16_2_ = auVar20._0_2_;
      auVar20._18_2_ = auVar20._0_2_;
      auVar20._20_2_ = auVar20._0_2_;
      auVar20._22_2_ = auVar20._0_2_;
      auVar20._24_2_ = auVar20._0_2_;
      auVar20._26_2_ = auVar20._0_2_;
      auVar20._28_2_ = auVar20._0_2_;
      auVar20._30_2_ = auVar20._0_2_;
      lVar12 = 0;
      do {
        auVar17 = vpaddsw_avx2(auVar20,*(undefined1 (*) [32])((long)local_c60 + lVar12));
        auVar17 = vpsraw_avx2(auVar17,ZEXT416(-uVar11));
        *(undefined1 (*) [32])((long)local_c60 + lVar12) = auVar17;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x200);
    }
    else if (bVar1 != 0) {
      lVar12 = 0;
      do {
        auVar20 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_c60 + lVar12),ZEXT416(uVar11));
        *(undefined1 (*) [32])((long)local_c60 + lVar12) = auVar20;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x200);
    }
    (*local_c78[1])(in,in,0xd);
    bVar1 = piVar8[1];
    uVar11 = (uint)(char)bVar1;
    if ((int)uVar11 < 0) {
      auVar17._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
      auVar17._2_2_ = auVar17._0_2_;
      auVar17._4_2_ = auVar17._0_2_;
      auVar17._6_2_ = auVar17._0_2_;
      auVar17._8_2_ = auVar17._0_2_;
      auVar17._10_2_ = auVar17._0_2_;
      auVar17._12_2_ = auVar17._0_2_;
      auVar17._14_2_ = auVar17._0_2_;
      auVar17._16_2_ = auVar17._0_2_;
      auVar17._18_2_ = auVar17._0_2_;
      auVar17._20_2_ = auVar17._0_2_;
      auVar17._22_2_ = auVar17._0_2_;
      auVar17._24_2_ = auVar17._0_2_;
      auVar17._26_2_ = auVar17._0_2_;
      auVar17._28_2_ = auVar17._0_2_;
      auVar17._30_2_ = auVar17._0_2_;
      lVar12 = 0;
      do {
        auVar20 = vpaddsw_avx2(auVar17,*(undefined1 (*) [32])((long)local_c60 + lVar12));
        auVar20 = vpsraw_avx2(auVar20,ZEXT416(-uVar11));
        *(undefined1 (*) [32])((long)local_c60 + lVar12) = auVar20;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x200);
    }
    else if (bVar1 != 0) {
      lVar12 = 0;
      do {
        auVar20 = vpsllw_avx2(*(undefined1 (*) [32])((long)local_c60 + lVar12),ZEXT416(uVar11));
        *(undefined1 (*) [32])((long)local_c60 + lVar12) = auVar20;
        lVar12 = lVar12 + 0x20;
      } while (lVar12 != 0x200);
    }
    transpose_16bit_16x16_avx2(in,(__m256i *)(local_860 + lVar14 * 0x40));
    lVar14 = 1;
    bVar9 = false;
  } while (bVar16);
  if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
    lVar14 = 0x400;
    plVar13 = local_860;
    do {
      lVar5 = plVar13[1];
      lVar6 = plVar13[2];
      lVar7 = plVar13[3];
      *(longlong *)((long)&local_c80 + lVar14) = *plVar13;
      *(longlong *)((long)local_c78 + lVar14) = lVar5;
      *(longlong *)((long)local_c78 + lVar14 + 8) = lVar6;
      *(longlong *)((long)&local_c68 + lVar14) = lVar7;
      plVar13 = plVar13 + 4;
      lVar14 = lVar14 + -0x20;
    } while (lVar14 != 0);
  }
  else {
    in = (__m256i *)local_860;
  }
  (*local_c78[0])(in,in,0xd);
  bVar1 = piVar8[2];
  if ((char)bVar1 < '\0') {
    auVar21._0_2_ = (undefined2)(1 << (~bVar1 & 0x1f));
    auVar21._2_2_ = auVar21._0_2_;
    auVar21._4_2_ = auVar21._0_2_;
    auVar21._6_2_ = auVar21._0_2_;
    auVar21._8_2_ = auVar21._0_2_;
    auVar21._10_2_ = auVar21._0_2_;
    auVar21._12_2_ = auVar21._0_2_;
    auVar21._14_2_ = auVar21._0_2_;
    auVar21._16_2_ = auVar21._0_2_;
    auVar21._18_2_ = auVar21._0_2_;
    auVar21._20_2_ = auVar21._0_2_;
    auVar21._22_2_ = auVar21._0_2_;
    auVar21._24_2_ = auVar21._0_2_;
    auVar21._26_2_ = auVar21._0_2_;
    auVar21._28_2_ = auVar21._0_2_;
    auVar21._30_2_ = auVar21._0_2_;
    lVar14 = 0;
    do {
      auVar20 = vpaddsw_avx2(auVar21,*(undefined1 (*) [32])((long)*in + lVar14));
      auVar20 = vpsraw_avx2(auVar20,ZEXT416((uint)-(int)(char)bVar1));
      *(undefined1 (*) [32])((long)*in + lVar14) = auVar20;
      lVar14 = lVar14 + 0x20;
    } while (lVar14 != 0x400);
  }
  else if (bVar1 != 0) {
    lVar14 = 0;
    do {
      auVar20 = vpsllw_avx2(*(undefined1 (*) [32])((long)*in + lVar14),
                            ZEXT416((uint)(int)(char)bVar1));
      *(undefined1 (*) [32])((long)*in + lVar14) = auVar20;
      lVar14 = lVar14 + 0x20;
    } while (lVar14 != 0x400);
  }
  lVar14 = 0;
  auVar18._8_2_ = 1;
  auVar18._0_8_ = 0x1000100010001;
  auVar18._10_2_ = 1;
  auVar18._12_2_ = 1;
  auVar18._14_2_ = 1;
  auVar18._16_2_ = 1;
  auVar18._18_2_ = 1;
  auVar18._20_2_ = 1;
  auVar18._22_2_ = 1;
  auVar18._24_2_ = 1;
  auVar18._26_2_ = 1;
  auVar18._28_2_ = 1;
  auVar18._30_2_ = 1;
  auVar19._8_4_ = 0x80016a1;
  auVar19._0_8_ = 0x80016a1080016a1;
  auVar19._12_4_ = 0x80016a1;
  auVar19._16_4_ = 0x80016a1;
  auVar19._20_4_ = 0x80016a1;
  auVar19._24_4_ = 0x80016a1;
  auVar19._28_4_ = 0x80016a1;
  do {
    auVar17 = vpermq_avx2(*(undefined1 (*) [32])((long)*in + lVar14),0xd8);
    auVar20 = vpunpcklwd_avx2(auVar17,auVar18);
    auVar17 = vpunpckhwd_avx2(auVar17,auVar18);
    auVar20 = vpmaddwd_avx2(auVar20,auVar19);
    auVar21 = vpsrad_avx2(auVar20,0xc);
    auVar20 = vpmaddwd_avx2(auVar17,auVar19);
    auVar20 = vpsrad_avx2(auVar20,0xc);
    *(undefined1 (*) [32])((long)local_c80 + lVar14 * 2) = auVar21;
    *(undefined1 (*) [32])((long)local_c80 + lVar14 * 2 + 0x20) = auVar20;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0x400);
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_32x16_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m256i buf0[32], buf1[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X16];
  const int txw_idx = get_txw_idx(TX_32X16);
  const int txh_idx = get_txh_idx(TX_32X16);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 32;
  const int height = 16;
  const transform_1d_avx2 col_txfm = col_txfm16x16_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm16x32_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  for (int i = 0; i < 2; i++) {
    if (ud_flip) {
      load_buffer_16bit_to_16bit_flip_avx2(input + 16 * i, stride, buf0,
                                           height);
    } else {
      load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    }
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    transpose_16bit_16x16_avx2(buf0, buf1 + 0 * width + 16 * i);
  }

  __m256i *buf;
  if (lr_flip) {
    buf = buf0;
    flip_buf_avx2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit_w16_avx2(buf, width, shift[2]);
  store_rect_buffer_16bit_to_32bit_w16_avx2(buf, output, height, width);
}